

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

Mat * ncnn::Mat::from_pixels_resize
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                int target_width,int target_height,Allocator *allocator)

{
  Mat *pMVar1;
  int iVar2;
  ulong uVar3;
  uchar *puVar4;
  long lVar5;
  void *ptr;
  void *local_88;
  Mat *pMStack_80;
  undefined8 local_78;
  undefined4 local_70;
  long *local_68;
  undefined4 local_60;
  int local_5c;
  int local_58;
  undefined4 local_54;
  long local_50;
  Mat *local_40;
  uchar *local_38;
  
  if (h == target_height && w == target_width) {
    from_pixels(__return_storage_ptr__,pixels,type,w,h,stride,allocator);
    return __return_storage_ptr__;
  }
  if ((type & 0xffffU) - 1 < 2) {
    local_88 = (void *)0x0;
    pMStack_80 = (Mat *)0x0;
    local_78 = 3;
    local_70 = 3;
    local_68 = (long *)0x0;
    local_60 = 2;
    local_5c = target_width;
    local_58 = target_height;
    local_54 = 1;
    local_50 = (long)(target_height * target_width);
    if (target_height * target_width == 0) {
      puVar4 = (uchar *)0x0;
    }
    else {
      uVar3 = local_50 * 3 + 3U & 0xfffffffffffffffc;
      ptr = (void *)0x0;
      local_40 = __return_storage_ptr__;
      iVar2 = posix_memalign(&ptr,0x10,uVar3 + 4);
      local_88 = (void *)0x0;
      if (iVar2 == 0) {
        local_88 = ptr;
      }
      pMStack_80 = (Mat *)(uVar3 + (long)local_88);
      *(undefined4 *)((long)local_88 + uVar3) = 1;
      __return_storage_ptr__ = local_40;
      puVar4 = (uchar *)ptr;
    }
    pMVar1 = pMStack_80;
    resize_bilinear_c3(pixels,w,h,stride,puVar4,target_width,target_height,target_width * 3);
    from_pixels(__return_storage_ptr__,puVar4,type,target_width,target_height,allocator);
    if (pMVar1 == (Mat *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)&pMVar1->data = *(int *)&pMVar1->data + -1;
    UNLOCK();
    if (*(int *)&pMVar1->data != 0) {
      return __return_storage_ptr__;
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 0x18))();
      return __return_storage_ptr__;
    }
  }
  else if ((type & 0xffffU) == 3) {
    local_88 = (void *)0x0;
    pMStack_80 = (Mat *)0x0;
    local_78 = 1;
    local_70 = 1;
    local_68 = (long *)0x0;
    local_60 = 2;
    local_5c = target_width;
    local_58 = target_height;
    local_54 = 1;
    local_50 = (long)(target_height * target_width);
    if (target_height * target_width == 0) {
      local_40 = (Mat *)0x0;
      puVar4 = (uchar *)0x0;
    }
    else {
      uVar3 = local_50 + 3U & 0xfffffffffffffffc;
      ptr = (void *)0x0;
      local_38 = pixels;
      iVar2 = posix_memalign(&ptr,0x10,uVar3 + 4);
      local_88 = (void *)0x0;
      if (iVar2 == 0) {
        local_88 = ptr;
      }
      local_40 = (Mat *)((long)local_88 + uVar3);
      *(undefined4 *)((long)local_88 + uVar3) = 1;
      pixels = local_38;
      puVar4 = (uchar *)ptr;
    }
    pMStack_80 = local_40;
    resize_bilinear_c1(pixels,w,h,stride,puVar4,target_width,target_height,target_width);
    from_pixels(__return_storage_ptr__,puVar4,type,target_width,target_height,allocator);
    if (local_40 == (Mat *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)&local_40->data = *(int *)&local_40->data + -1;
    UNLOCK();
    if (*(int *)&local_40->data != 0) {
      return __return_storage_ptr__;
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 0x18))();
      return __return_storage_ptr__;
    }
  }
  else {
    if ((type & 0xfffeU) != 4) {
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      return __return_storage_ptr__;
    }
    local_88 = (void *)0x0;
    pMStack_80 = (Mat *)0x0;
    local_78 = 4;
    local_70 = 4;
    local_68 = (long *)0x0;
    local_60 = 2;
    local_5c = target_width;
    local_58 = target_height;
    local_54 = 1;
    lVar5 = (long)(target_height * target_width);
    local_50 = lVar5;
    if (target_height * target_width == 0) {
      puVar4 = (uchar *)0x0;
    }
    else {
      ptr = (void *)0x0;
      local_38 = pixels;
      iVar2 = posix_memalign(&ptr,0x10,lVar5 * 4 + 4);
      local_88 = (void *)0x0;
      if (iVar2 == 0) {
        local_88 = ptr;
      }
      pMStack_80 = (Mat *)((long)local_88 + lVar5 * 4);
      *(undefined4 *)&pMStack_80->data = 1;
      pixels = local_38;
      puVar4 = (uchar *)ptr;
    }
    pMVar1 = pMStack_80;
    resize_bilinear_c4(pixels,w,h,stride,puVar4,target_width,target_height,target_width * 4);
    from_pixels(__return_storage_ptr__,puVar4,type,target_width,target_height,allocator);
    if (pMVar1 == (Mat *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)&pMVar1->data = *(int *)&pMVar1->data + -1;
    UNLOCK();
    if (*(int *)&pMVar1->data != 0) {
      return __return_storage_ptr__;
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 0x18))();
      return __return_storage_ptr__;
    }
  }
  if (local_88 != (void *)0x0) {
    local_68 = (long *)0x0;
    free(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    return Mat();
}